

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WorldCoordinates.cpp
# Opt level: O0

KFLOAT64 __thiscall
KDIS::DATA_TYPE::WorldCoordinates::GetDistance(WorldCoordinates *this,WorldCoordinates *Other)

{
  double dVar1;
  KFLOAT64 f;
  WorldCoordinates w;
  WorldCoordinates *Other_local;
  WorldCoordinates *this_local;
  
  w.m_f64Z = (KFLOAT64)Other;
  operator-((WorldCoordinates *)&f,this,Other);
  dVar1 = sqrt((double)w.m_f64Y * (double)w.m_f64Y +
               (double)w.super_DataTypeBase._vptr_DataTypeBase *
               (double)w.super_DataTypeBase._vptr_DataTypeBase + (double)w.m_f64X * (double)w.m_f64X
              );
  ~WorldCoordinates((WorldCoordinates *)&f);
  return (KFLOAT64)dVar1;
}

Assistant:

KFLOAT64 WorldCoordinates::GetDistance( const WorldCoordinates & Other )
{
    WorldCoordinates w = *this - Other;
    KFLOAT64 f = ( w.m_f64X * w.m_f64X ) + ( w.m_f64Y * w.m_f64Y ) + ( w.m_f64Z * w.m_f64Z );
    return sqrt( f );
}